

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.hh
# Opt level: O0

point3d * __thiscall
tinyusdz::value::MultV<tinyusdz::value::matrix4d,tinyusdz::value::point3d,double,double,3ul>
          (point3d *__return_storage_ptr__,value *this,matrix4d *m,point3d *v)

{
  double dVar1;
  double *pdVar2;
  double dVar3;
  ulong local_30;
  size_t i;
  Ty value;
  size_t j;
  point3d *v_local;
  matrix4d *m_local;
  
  for (value = 0.0; (ulong)value < 3; value = (Ty)((long)value + 1)) {
    i = 0;
    for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
      dVar1 = *(double *)(this + (long)value * 8 + local_30 * 0x20);
      dVar3 = point3d::operator[]((point3d *)m,local_30);
      i = (size_t)(dVar1 * dVar3 + (double)i);
    }
    pdVar2 = point3d::operator[](__return_storage_ptr__,(size_t)value);
    *pdVar2 = (double)i;
  }
  return __return_storage_ptr__;
}

Assistant:

VTy MultV(const MTy &m, const VTy &v) {
  // MBaseTy must be float or double
  // TODO: use std::enable_if?
  static_assert(std::is_same<MBaseTy, double>::value || std::is_same<MBaseTy, float>::value,
    "Matrix element type must be `float` or `double`");

  // Intermediate type. Choose higher precision based on its size.
  typedef typename std::conditional<sizeof(MBaseTy) >= sizeof(VBaseTy), MBaseTy, VBaseTy>::type Ty;

  VTy ret;

  for (size_t j = 0; j < N; j++) {
    Ty value = static_cast<Ty>(0);
    for (size_t i = 0; i < N; i++) {
      value += static_cast<Ty>(m.m[i][j]) * static_cast<Ty>(v[i]);
    }
    ret[j] = static_cast<VBaseTy>(value);
  }

  return ret;
}